

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O1

void CoreML::Specification::protobuf_TreeEnsemble_2eproto::TableStruct::Shutdown(void)

{
  if (DAT_003e35d8 == '\x01') {
    DAT_003e35d8 = '\0';
    (*(code *)*_TreeEnsembleParameters_TreeNode_EvaluationInfo_default_instance_)();
  }
  if (DAT_003e3650 == '\x01') {
    DAT_003e3650 = '\0';
    (*(code *)*_TreeEnsembleParameters_TreeNode_default_instance_)();
  }
  if (DAT_003e36a8 == '\x01') {
    DAT_003e36a8 = '\0';
    (*(code *)*_TreeEnsembleParameters_default_instance_)();
  }
  if (DAT_003e36e0 == '\x01') {
    DAT_003e36e0 = '\0';
    (*(code *)*_TreeEnsembleClassifier_default_instance_)();
  }
  if (DAT_003e3718 == '\x01') {
    DAT_003e3718 = 0;
    (*(code *)*_TreeEnsembleRegressor_default_instance_)();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _TreeEnsembleParameters_TreeNode_EvaluationInfo_default_instance_.Shutdown();
  _TreeEnsembleParameters_TreeNode_default_instance_.Shutdown();
  _TreeEnsembleParameters_default_instance_.Shutdown();
  _TreeEnsembleClassifier_default_instance_.Shutdown();
  _TreeEnsembleRegressor_default_instance_.Shutdown();
}